

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

us_listen_socket_t *
us_socket_context_listen
          (int ssl,us_socket_context_t *context,char *host,int port,int options,int socket_ext_size)

{
  int fd;
  us_socket_context_t *in_RSI;
  int in_EDI;
  uint in_R9D;
  us_listen_socket_t *ls;
  us_poll_t *p;
  int listen_socket_fd;
  int in_stack_00000040;
  int in_stack_00000044;
  char *in_stack_00000048;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  us_loop_t *in_stack_ffffffffffffffc0;
  int events;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  us_loop_t *local_8;
  
  if (in_EDI == 0) {
    fd = bsd_create_listen_socket(in_stack_00000048,in_stack_00000044,in_stack_00000040);
    if (fd == -1) {
      local_8 = (us_loop_t *)0x0;
    }
    else {
      local_8 = (us_loop_t *)
                us_create_poll(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                               in_stack_ffffffffffffffb8);
      events = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
      us_poll_init((us_poll_t *)local_8,fd,2);
      us_poll_start((us_poll_t *)CONCAT44(in_R9D,fd),local_8,events);
      *(us_socket_context_t **)&(local_8->data).last_write_failed = in_RSI;
      *(unsigned_short *)&(local_8->data).recv_buf = 0;
      (local_8->data).iterator = (us_socket_context_t *)0x0;
      us_internal_socket_context_link(in_RSI,(us_socket_t *)local_8);
      *(uint *)&(local_8->data).ssl_data = in_R9D;
    }
  }
  else {
    local_8 = (us_loop_t *)
              us_internal_ssl_socket_context_listen
                        ((us_internal_ssl_socket_context_t *)
                         CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                         (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                         (int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return (us_listen_socket_t *)local_8;
}

Assistant:

struct us_listen_socket_t *us_socket_context_listen(int ssl, struct us_socket_context_t *context, const char *host, int port, int options, int socket_ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return us_internal_ssl_socket_context_listen((struct us_internal_ssl_socket_context_t *) context, host, port, options, socket_ext_size);
    }
#endif

    LIBUS_SOCKET_DESCRIPTOR listen_socket_fd = bsd_create_listen_socket(host, port, options);

    if (listen_socket_fd == LIBUS_SOCKET_ERROR) {
        return 0;
    }

    struct us_poll_t *p = us_create_poll(context->loop, 0, sizeof(struct us_listen_socket_t));
    us_poll_init(p, listen_socket_fd, POLL_TYPE_SEMI_SOCKET);
    us_poll_start(p, context->loop, LIBUS_SOCKET_READABLE);

    struct us_listen_socket_t *ls = (struct us_listen_socket_t *) p;

    ls->s.context = context;
    ls->s.timeout = 0;
    ls->s.next = 0;
    us_internal_socket_context_link(context, &ls->s);

    ls->socket_ext_size = socket_ext_size;

    return ls;
}